

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O3

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,char *str)

{
  char *pcVar1;
  string buffer;
  char *local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[0xb])(this,&local_40);
  pcVar1 = local_40;
  strcpy(str,local_40);
  if (pcVar1 != &local_30) {
    operator_delete(pcVar1,CONCAT71(uStack_2f,local_30) + 1);
  }
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(char* str) {
    /*
    bool stop = 0;
    int cnt = 0;
    char loa[2];
    loa[1]=0;

    while(true)
    {

        try {Input(loa, 1);}
        catch (const std::exception&)
        {
            if (!(this->End_of_stream() && cnt>0))
                throw (ChException("Cannot read from stream"));
        }

        if (this->End_of_stream() || loa[0]==*"\n" || loa[0]==*" " || loa[0]==*"\t" || loa[0]==0)
            break;

        str[cnt]=loa[0];
        cnt++;
    }
    str[cnt]=NULL;
    */

    std::string buffer;
    *this >> buffer;
    strcpy(str, buffer.c_str());

    return *this;
}